

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSwap(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t Val;
  DecodeStatus DVar2;
  uint pred;
  uint Rn;
  uint Rt2;
  uint Rt;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  _Rt = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  RegNo_01 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  if (Val == 0xf) {
    Inst_local._4_4_ =
         DecodeCPSInstruction(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Rt);
  }
  else {
    Rt2 = 3;
    if ((RegNo == RegNo_01) || (RegNo_01 == RegNo_00)) {
      Rt2 = 1;
    }
    DVar2 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rt);
    _Var1 = Check(&Rt2,DVar2);
    if (_Var1) {
      DVar2 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rt2,DVar2);
      if (_Var1) {
        DVar2 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_Rt);
        _Var1 = Check(&Rt2,DVar2);
        if (_Var1) {
          DVar2 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_Rt);
          _Var1 = Check(&Rt2,DVar2);
          if (_Var1) {
            Inst_local._4_4_ = Rt2;
          }
          else {
            Inst_local._4_4_ = MCDisassembler_Fail;
          }
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSwap(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S;

	unsigned Rt   = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2  = fieldFromInstruction_4(Insn, 0,  4);
	unsigned Rn   = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (pred == 0xF)
		return DecodeCPSInstruction(Inst, Insn, Address, Decoder);

	S = MCDisassembler_Success;

	if (Rt == Rn || Rn == Rt2)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}